

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativePreciseTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateAndVerifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,TestPrecise test)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  int length;
  string shaderSource;
  char *source;
  Shader shader;
  undefined1 auStack_238 [4];
  int local_234;
  long *local_230;
  int local_228;
  long local_220 [2];
  long *local_210;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [6];
  ios_base local_198 [264];
  Shader local_90;
  
  glu::Shader::Shader(&local_90,ctx->m_renderCtx,shaderType);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)(auStack_238 + (long)*(_func_int **)(local_208._0_8_ + -0x18)) + 0x30);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\n",1);
  pcVar2 = "#extension GL_EXT_gpu_shader5 : enable\n";
  if (bVar1) {
    pcVar2 = glcts::fixed_sample_locations_values + 1;
  }
  lVar4 = 0x27;
  if (bVar1) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
  if (shaderType == SHADERTYPE_TESSELLATION_EVALUATION) {
    pcVar2 = "#extension GL_EXT_tessellation_shader : enable\n";
    if (bVar1) {
      pcVar2 = glcts::fixed_sample_locations_values + 1;
    }
    lVar4 = 0x2f;
    if (bVar1) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
    lVar4 = 0x29;
    pcVar2 = "layout(triangles, equal_spacing, cw) in;\n";
LAB_01613de9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
  }
  else {
    if (shaderType == SHADERTYPE_TESSELLATION_CONTROL) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : enable\n";
      if (bVar1) {
        pcVar2 = glcts::fixed_sample_locations_values + 1;
      }
      lVar4 = 0x2f;
      if (bVar1) {
        lVar4 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
      lVar4 = 0x1a;
      pcVar2 = "layout(vertices = 3) out;\n";
      goto LAB_01613de9;
    }
    if (shaderType == SHADERTYPE_GEOMETRY) {
      pcVar2 = "#extension GL_EXT_geometry_shader : enable\n";
      if (bVar1) {
        pcVar2 = glcts::fixed_sample_locations_values + 1;
      }
      lVar4 = 0x2b;
      if (bVar1) {
        lVar4 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
      lVar4 = 0x1e;
      pcVar2 = "layout(max_vertices = 5) out;\n";
      goto LAB_01613de9;
    }
  }
  switch(test) {
  case TEST_PRECISE_AS_FUNCTION_NAME:
  case TEST_PRECISE_MACRO_AND_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\n",1);
    lVar4 = 0xf;
    pcVar2 = "void precise()\n";
    break;
  case TEST_PRECISE_AS_ARGUMENT_NAME:
  case TEST_PRECISE_MACRO_AND_ARGUMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\n",1);
    lVar4 = 0x1a;
    pcVar2 = "void example(int precise)\n";
    break;
  default:
    goto switchD_01613e0e_caseD_3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar2,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"}\n",2);
switchD_01613e0e_caseD_3:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"{\n",2);
  if ((test & ~TEST_PRECISE_MACRO_AND_VARIABLE) == TEST_PRECISE_AS_VARIABLE_NAME) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"\tint precise = 1;\n",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base(local_198);
  local_210 = local_230;
  local_234 = local_228;
  glu::Shader::setSources(&local_90,1,(char **)&local_210,&local_234);
  glu::Shader::compile(&local_90);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&local_90);
  if (local_90.m_info.compileOk == true) {
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Shader was not expected to compile.","");
    NegativeTestContext::fail(ctx,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
    }
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  glu::Shader::~Shader(&local_90);
  return;
}

Assistant:

void generateAndVerifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, TestPrecise test)
{
	glu::Shader			shader			(ctx.getRenderContext(), shaderType);
	std::string			shaderSource	= generateShaderSource(ctx, shaderType, test);
	const char* const	source			= shaderSource.c_str();
	const int			length			= (int) shaderSource.size();

	shader.setSources(1, &source, &length);
	shader.compile();

	ctx.getLog() << shader;

	if (shader.getCompileStatus())
		ctx.fail("Shader was not expected to compile.");
}